

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O0

char * flatcc_json_parser_space(flatcc_json_parser_t *ctx,char *buf,char *end)

{
  char *pcVar1;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  if (1 < (long)end - (long)buf) {
    if (' ' < *buf) {
      return buf;
    }
    if ((*buf == ' ') && (' ' < buf[1])) {
      return buf + 1;
    }
  }
  pcVar1 = flatcc_json_parser_space_ext(ctx,buf,end);
  return pcVar1;
}

Assistant:

static inline const char *flatcc_json_parser_space(flatcc_json_parser_t *ctx, const char *buf, const char *end)
{
    if (end - buf > 1) {
        if (buf[0] > 0x20) {
            return buf;
        }
        if (buf[0] == 0x20 && buf[1] > 0x20) {
            return buf + 1;
        }
    }
    return flatcc_json_parser_space_ext(ctx, buf, end);
}